

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O2

TiXmlString __thiscall despot::util::tinyxml::operator+(tinyxml *this,TiXmlString *a,TiXmlString *b)

{
  *(undefined1 **)this = TiXmlString::nullrep_;
  TiXmlString::reserve((TiXmlString *)this,b->rep_->size + a->rep_->size);
  TiXmlString::operator+=((TiXmlString *)this,a);
  TiXmlString::operator+=((TiXmlString *)this,b);
  return (TiXmlString)(Rep *)this;
}

Assistant:

TiXmlString operator +(const TiXmlString & a, const TiXmlString & b) {
	TiXmlString tmp;
	tmp.reserve(a.length() + b.length());
	tmp += a;
	tmp += b;
	return tmp;
}